

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase464::run(TestCase464 *this)

{
  PromiseArena *pPVar1;
  long *plVar2;
  OwnPromiseNode OVar3;
  char *pcVar4;
  size_t sVar5;
  void *pvVar6;
  TransformPromiseNodeBase *pTVar7;
  long lVar8;
  OwnPromiseNode intermediate_1;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:473:11),_unsigned_long>
  promise;
  String result2;
  String result;
  TwoWayPipe pipe;
  AsyncIoContext ioContext;
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  OwnPromiseNode local_148;
  OwnPromiseNode local_140;
  undefined1 local_138 [8];
  OwnPromiseNode local_130;
  OwnPromiseNode local_128;
  TransformPromiseNodeBase *local_120;
  String local_118;
  String local_f8;
  _func_int *local_d8;
  long local_d0 [3];
  undefined8 *local_b8;
  long *local_b0;
  undefined8 *local_a8;
  long *local_a0;
  char *local_88;
  char *pcStack_80;
  byte local_78 [8];
  char *local_70;
  char *pcStack_68;
  byte local_60 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> local_58;
  
  setupAsyncIo();
  (**(code **)(*local_a0 + 8))(&local_d8);
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  (*(code *)**(undefined8 **)(local_d0[0] + 8))
            (&local_148,local_d0[0] + 8,&kj::_::ByteLiteral<4ul>,3);
  OVar3.ptr = local_148.ptr;
  pPVar1 = ((local_148.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_148.ptr - (long)pPVar1) < 0x30) {
    pvVar6 = operator_new(0x400);
    pTVar7 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_148,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:471:54)>
               ::anon_class_16_2_40a49b79_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d0) = &PTR_destroy_0060dbb0;
    *(_func_int ***)((long)pvVar6 + 0x3f0) = &local_d8;
    *(undefined1 **)((long)pvVar6 + 0x3f8) = local_138 + 4;
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    ((local_148.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar7 = (TransformPromiseNodeBase *)(local_148.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_148,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:471:54)>
               ::anon_class_16_2_40a49b79_for_func::operator());
    OVar3.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060dbb0;
    OVar3.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = &local_d8;
    OVar3.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)(local_138 + 4);
    OVar3.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_58.left = (char (*) [4])&DAT_0048a171;
  local_58.right = (String *)&DAT_0048a1d0;
  local_58.op.content.ptr = &DAT_4c0000058b;
  local_118.content.ptr = (char *)pTVar7;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_f8,(OwnPromiseNode *)&local_118,(SourceLocation *)&local_58);
  pcVar4 = local_118.content.ptr;
  local_140.ptr = (PromiseNode *)local_f8.content.ptr;
  if ((TransformPromiseNodeBase *)local_118.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_118.content.ptr = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar4);
  }
  OVar3.ptr = local_140.ptr;
  pPVar1 = ((local_140.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_140.ptr - (long)pPVar1) < 0x28) {
    pvVar6 = operator_new(0x400);
    pTVar7 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_140,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:473:11)>
               ::anon_class_8_1_8ba005cc_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_0060dc08;
    *(undefined1 **)((long)pvVar6 + 0x3f8) = local_138 + 4;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((local_140.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar7 = (TransformPromiseNodeBase *)&local_140.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_140,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:473:11)>
               ::anon_class_8_1_8ba005cc_for_func::operator());
    OVar3.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0060dc08;
    OVar3.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)(local_138 + 4);
    OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar3.ptr = local_140.ptr;
  local_120 = pTVar7;
  if (&(local_140.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_140.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  OVar3.ptr = local_148.ptr;
  if (&(local_148.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_148.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  (*(code *)**(undefined8 **)(local_d0[2] + 8))
            (&local_130,local_d0[2] + 8,&kj::_::ByteLiteral<4ul>,3);
  OVar3.ptr = local_130.ptr;
  pPVar1 = ((local_130.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_130.ptr - (long)pPVar1) < 0x30) {
    pvVar6 = operator_new(0x400);
    pTVar7 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_130,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:478:59)>
               ::anon_class_16_2_40a49b7a_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d0) = &PTR_destroy_0060dc60;
    *(_func_int ***)((long)pvVar6 + 0x3f0) = &local_d8;
    *(undefined1 **)((long)pvVar6 + 0x3f8) = local_138;
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    ((local_130.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar7 = (TransformPromiseNodeBase *)(local_130.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_130,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:478:59)>
               ::anon_class_16_2_40a49b7a_for_func::operator());
    OVar3.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0060dc60;
    OVar3.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = &local_d8;
    OVar3.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_138;
    OVar3.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_58.left = (char (*) [4])&DAT_0048a171;
  local_58.right = (String *)&DAT_0048a1d0;
  local_58.op.content.ptr = &DAT_4c0000058b;
  local_140.ptr = &pTVar7->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_118,&local_140,(SourceLocation *)&local_58);
  OVar3.ptr = local_140.ptr;
  local_128.ptr = (PromiseNode *)local_118.content.ptr;
  if ((TransformPromiseNodeBase *)local_140.ptr != (TransformPromiseNodeBase *)0x0) {
    local_140.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  OVar3.ptr = local_128.ptr;
  pPVar1 = ((local_128.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_128.ptr - (long)pPVar1) < 0x28) {
    pvVar6 = operator_new(0x400);
    pTVar7 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_128,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:480:11)>
               ::anon_class_8_1_8ba005cd_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_0060dcb8;
    *(undefined1 **)((long)pvVar6 + 0x3f8) = local_138;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((local_128.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar7 = (TransformPromiseNodeBase *)((OwnPromiseNode *)(local_128.ptr + -3) + 1);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_128,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:480:11)>
               ::anon_class_8_1_8ba005cd_for_func::operator());
    ((OwnPromiseNode *)(OVar3.ptr + -3))[1] = (OwnPromiseNode)&PTR_destroy_0060dcb8;
    ((OwnPromiseNode *)(OVar3.ptr + -1))[1] = (OwnPromiseNode)local_138;
    (((TransformPromiseNodeBase *)(OVar3.ptr + -2))->super_PromiseNode).super_PromiseArenaMember.
    _vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_68 = "run";
  local_60[0] = 0xde;
  local_60[1] = '\x01';
  local_60[2] = '\0';
  local_60[3] = '\0';
  local_60[4] = '\x17';
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  local_148.ptr = &pTVar7->super_PromiseNode;
  Promise<kj::String>::wait((Promise<kj::String> *)&local_f8,&local_148);
  OVar3.ptr = local_148.ptr;
  if ((TransformPromiseNodeBase *)local_148.ptr != (TransformPromiseNodeBase *)0x0) {
    local_148.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  OVar3.ptr = local_128.ptr;
  if ((TransformPromiseNodeBase *)local_128.ptr != (TransformPromiseNodeBase *)0x0) {
    local_128.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  OVar3.ptr = local_130.ptr;
  if (&(local_130.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_130.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_80 = "run";
  local_78[0] = 0xe5;
  local_78[1] = '\x01';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\x18';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  Promise<kj::String>::wait((Promise<kj::String> *)&local_118,&local_120);
  local_140.ptr = (PromiseNode *)0x4d8ac4;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_58,(DebugExpression<char_const(&)[4]> *)&local_140,&local_f8);
  if ((local_58.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x1e7,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",&local_58,
               (char (*) [4])0x4d8ac4,&local_f8);
  }
  local_140.ptr = (PromiseNode *)0x4b858f;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&local_58,(DebugExpression<char_const(&)[4]> *)&local_140,&local_118);
  if ((local_58.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x1e8,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (result2)\", _kjCondition, \"bar\", result2"
               ,(char (*) [38])"failed: expected (\"bar\") == (result2)",&local_58,
               (char (*) [4])0x4b858f,&local_118);
  }
  sVar5 = local_118.content.size_;
  pcVar4 = local_118.content.ptr;
  if ((TransformPromiseNodeBase *)local_118.content.ptr != (TransformPromiseNodeBase *)0x0) {
    local_118.content.ptr = (char *)0x0;
    local_118.content.size_ = 0;
    (**(local_118.content.disposer)->_vptr_ArrayDisposer)
              (local_118.content.disposer,pcVar4,1,sVar5,sVar5,0);
  }
  sVar5 = local_f8.content.size_;
  pcVar4 = local_f8.content.ptr;
  if ((PromiseArenaMember *)local_f8.content.ptr != (PromiseArenaMember *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar4,1,sVar5,sVar5,0);
  }
  pTVar7 = local_120;
  if (local_120 != (TransformPromiseNodeBase *)0x0) {
    local_120 = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pTVar7);
  }
  lVar8 = 0x10;
  do {
    plVar2 = *(long **)((long)local_d0 + lVar8);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)local_d0 + lVar8) = 0;
      (**(code **)**(undefined8 **)((long)&local_d8 + lVar8))
                (*(undefined8 **)((long)&local_d8 + lVar8),(long)plVar2 + *(long *)(*plVar2 + -0x10)
                );
    }
    plVar2 = local_a0;
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -0x10);
  if (local_a0 != (long *)0x0) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_b0;
  if (local_b0 != (long *)0x0) {
    local_b0 = (long *)0x0;
    (**(code **)*local_b8)(local_b8,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, TwoWayPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newTwoWayPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  auto promise = pipe.ends[0]->write("foo"_kjb).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  kj::String result = pipe.ends[1]->write("bar"_kjb).then([&]() {
    return pipe.ends[1]->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
  EXPECT_EQ("bar", result2);
}